

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

cram_codec *
cram_encoder_init(cram_encoding codec,cram_stats *st,cram_external_type option,void *dat,int version
                 )

{
  FILE *__stream;
  char *pcVar1;
  cram_codec *r;
  int version_local;
  void *dat_local;
  cram_external_type option_local;
  cram_stats *st_local;
  cram_codec *pcStack_10;
  cram_encoding codec_local;
  
  __stream = _stderr;
  if ((st == (cram_stats *)0x0) || (st->nvals != 0)) {
    if (encode_init[codec] ==
        (_func_cram_codec_ptr_cram_stats_ptr_cram_external_type_void_ptr_int *)0x0) {
      pcVar1 = codec2str(codec);
      fprintf(__stream,"Unimplemented codec of type %s\n",pcVar1);
      abort();
    }
    pcStack_10 = (*encode_init[codec])(st,option,dat,version);
    if (pcStack_10 != (cram_codec *)0x0) {
      pcStack_10->out = (cram_block *)0x0;
    }
  }
  else {
    pcStack_10 = (cram_codec *)0x0;
  }
  return pcStack_10;
}

Assistant:

cram_codec *cram_encoder_init(enum cram_encoding codec,
			      cram_stats *st,
			      enum cram_external_type option,
			      void *dat,
			      int version) {
    if (st && !st->nvals)
	return NULL;

    if (encode_init[codec]) {
	cram_codec *r;
	if ((r = encode_init[codec](st, option, dat, version)))
	    r->out = NULL;
	return r;
    } else {
	fprintf(stderr, "Unimplemented codec of type %s\n", codec2str(codec));
	abort();
    }
}